

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O2

int __thiscall
QWaitConditionPrivate::wait_relative(QWaitConditionPrivate *this,QDeadlineTimer deadline)

{
  QDeadlineTimer deadline_00;
  int iVar1;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffd8;
  timespec local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  deadline_00._8_8_ = in_stack_ffffffffffffffd8;
  deadline_00.t1 = 0x386c6f;
  local_20 = deadlineToAbstime<1>(deadline_00);
  iVar1 = pthread_cond_timedwait
                    ((pthread_cond_t *)&this->cond,(pthread_mutex_t *)this,(timespec *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int wait_relative(QDeadlineTimer deadline)
    {
        timespec ti = deadlineToAbstime<QWaitConditionClockId>(deadline);
        return pthread_cond_timedwait(&cond, &mutex, &ti);
    }